

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O2

void __thiscall absl::SetProgramUsageMessage(absl *this,string_view new_usage_message)

{
  string *this_00;
  char *absl_raw_log_internal_filename;
  int local_20 [2];
  string_view new_usage_message_local;
  
  new_usage_message_local._M_str = (char *)new_usage_message._M_len;
  new_usage_message_local._M_len = (size_t)this;
  Mutex::Lock((Mutex *)&flags_internal::(anonymous_namespace)::usage_message_guard);
  if (flags_internal::(anonymous_namespace)::program_usage_message_abi_cxx11_ == (string *)0x0) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (this_00,&new_usage_message_local,(allocator<char> *)&absl_raw_log_internal_filename);
    flags_internal::(anonymous_namespace)::program_usage_message_abi_cxx11_ = this_00;
    Mutex::Unlock((Mutex *)&flags_internal::(anonymous_namespace)::usage_message_guard);
    return;
  }
  absl_raw_log_internal_filename =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/flags/usage.cc"
  ;
  local_20[1] = 3;
  local_20[0] = 0x2e;
  base_internal::AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
  ::operator()((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)> *
               )&raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_20 + 1),
               &absl_raw_log_internal_filename,local_20,
               (char (*) [39])"SetProgramUsageMessage() called twice.");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/flags/usage.cc"
                ,0x2e,"void absl::SetProgramUsageMessage(absl::string_view)");
}

Assistant:

void SetProgramUsageMessage(absl::string_view new_usage_message) {
  absl::MutexLock l(&flags_internal::usage_message_guard);

  if (flags_internal::program_usage_message != nullptr) {
    ABSL_INTERNAL_LOG(FATAL, "SetProgramUsageMessage() called twice.");
    std::exit(1);
  }

  flags_internal::program_usage_message = new std::string(new_usage_message);
}